

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O1

VRMatrix4 * __thiscall MinVR::VRMatrix4::cofactor(VRMatrix4 *__return_storage_ptr__,VRMatrix4 *this)

{
  int iVar1;
  int iVar2;
  int c;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  int r;
  long lVar6;
  float fVar7;
  
  VRMatrix4(__return_storage_ptr__);
  pfVar4 = __return_storage_ptr__->m;
  iVar2 = 1;
  lVar6 = 0;
  do {
    lVar3 = 0;
    pfVar5 = pfVar4;
    iVar1 = iVar2;
    do {
      iVar2 = iVar1;
      fVar7 = subDeterminant(this,(int)lVar6,(int)lVar3);
      *pfVar5 = (float)iVar2 * fVar7;
      lVar3 = lVar3 + 1;
      pfVar5 = pfVar5 + 4;
      iVar1 = -iVar2;
    } while (lVar3 != 4);
    lVar6 = lVar6 + 1;
    pfVar4 = pfVar4 + 1;
  } while (lVar6 != 4);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::cofactor() const {
  VRMatrix4 out;
  // We'll use i to incrementally compute -1^(r+c)
  int i = 1;
  for (int r = 0; r < 4; ++r) {
    for (int c = 0; c < 4; ++c) {
      // Compute the determinant of the 3x3 submatrix
      float det = subDeterminant(r, c);
      out(r,c) = i * det;
      i = -i;
    }
    i = -i;
  }
  return out;
}